

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O2

void testTiledCompression(string *tempDir)

{
  ushort uVar1;
  int w;
  undefined2 uVar2;
  uint uVar3;
  float fVar4;
  ostream *poVar5;
  void *pvVar6;
  int x_1;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int x;
  long lVar10;
  int y;
  long lVar11;
  ulong uVar12;
  double dVar13;
  Array2D<Imath_3_2::half> ph;
  Array2D<unsigned_int> pi;
  Array2D<float> pf;
  int in_stack_ffffffffffffff38;
  int h;
  long lVar14;
  long lVar15;
  Array2D<unsigned_int> local_a0;
  Array2D<float> local_88;
  string *local_70;
  long local_68;
  double local_60;
  ushort local_56 [3];
  long local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_70 = tempDir;
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "Testing pixel data types and data window offsets for tiled files");
  std::endl<char,std::char_traits<char>>(poVar5);
  local_a0._sizeX = 0x3b;
  local_a0._sizeY = 0xab;
  local_a0._data = (uint *)operator_new__(0x9da4);
  lVar14 = 0x3b;
  lVar15 = 0xab;
  pvVar6 = operator_new__(0x4ed2);
  local_88._sizeX = 0x3b;
  local_88._sizeY = 0xab;
  local_88._data = (float *)operator_new__(0x9da4);
  lVar7 = 0;
  while (lVar7 != 3) {
    local_68 = lVar7;
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"xOffset = ");
    w = *(int *)(&DAT_001a89f8 + local_68 * 4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,w);
    poVar5 = std::operator<<(poVar5,", yOffset = ");
    h = *(int *)(&DAT_001a8a04 + local_68 * 4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,h);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"only zeroes");
    std::endl<char,std::char_traits<char>>(poVar5);
    lVar7 = 0;
    lVar10 = 0;
    for (lVar11 = 0; lVar11 != 0x3b; lVar11 = lVar11 + 1) {
      for (lVar8 = 0; lVar8 != 0x156; lVar8 = lVar8 + 2) {
        *(undefined4 *)((long)local_a0._data + lVar8 * 2 + local_a0._sizeY * lVar10) = 0;
        Imath_3_2::half::operator=((half *)((long)pvVar6 + lVar8 + lVar15 * lVar7),0.0);
        *(undefined4 *)((long)local_88._data + lVar8 * 2 + local_88._sizeY * lVar10) = 0;
      }
      lVar10 = lVar10 + 4;
      lVar7 = lVar7 + 2;
    }
    anon_unknown.dwarf_29dd79::writeRead
              (local_70,&local_a0,(Array2D<Imath_3_2::half> *)&stack0xffffffffffffff48,&local_88,w,h
               ,in_stack_ffffffffffffff38,h,(int)lVar14,(int)lVar15);
    poVar5 = std::operator<<((ostream *)&std::cout,"pattern 1");
    std::endl<char,std::char_traits<char>>(poVar5);
    lVar7 = 0;
    lVar10 = 0;
    for (uVar12 = 0; uVar12 != 0x3b; uVar12 = uVar12 + 1) {
      uVar9 = uVar12 & 0xffffffff;
      for (lVar11 = 0; lVar11 != 0x156; lVar11 = lVar11 + 2) {
        uVar3 = (uint)uVar9 & 1;
        *(uint *)((long)local_a0._data + lVar11 * 2 + local_a0._sizeY * lVar10) = uVar3;
        Imath_3_2::half::operator=((half *)((long)pvVar6 + lVar11 + lVar15 * lVar7),(float)uVar3);
        *(float *)((long)local_88._data + lVar11 * 2 + local_88._sizeY * lVar10) =
             (float)*(uint *)((long)local_a0._data + lVar11 * 2 + local_a0._sizeY * lVar10);
        uVar9 = (ulong)((uint)uVar9 + 1);
      }
      lVar10 = lVar10 + 4;
      lVar7 = lVar7 + 2;
    }
    anon_unknown.dwarf_29dd79::writeRead
              (local_70,&local_a0,(Array2D<Imath_3_2::half> *)&stack0xffffffffffffff48,&local_88,w,h
               ,in_stack_ffffffffffffff38,h,(int)lVar14,(int)lVar15);
    poVar5 = std::operator<<((ostream *)&std::cout,"pattern 2");
    std::endl<char,std::char_traits<char>>(poVar5);
    lVar10 = 0;
    lVar11 = 0;
    lVar7 = 0;
    while (lVar7 != 0x3b) {
      local_40 = (double)(int)lVar7;
      local_48 = local_40 * 0.5;
      lVar8 = 0;
      local_50 = lVar7;
      for (uVar12 = 0; uVar12 != 0xab; uVar12 = uVar12 + 1) {
        uVar9 = uVar12 - 100;
        if (uVar12 < 100) {
          uVar9 = uVar12;
        }
        *(int *)((long)local_a0._data + lVar8 * 2 + local_a0._sizeY * lVar11) =
             (int)uVar9 + (int)lVar7 * 100;
        local_38 = (double)(int)uVar12;
        local_60 = sin(local_38);
        dVar13 = sin(local_48);
        Imath_3_2::half::operator=
                  ((half *)((long)pvVar6 + lVar8 + lVar15 * lVar10),(float)(dVar13 + local_60));
        local_60 = sin(local_40);
        dVar13 = sin(local_38 * 0.5);
        *(float *)((long)local_88._data + lVar8 * 2 + local_88._sizeY * lVar11) =
             (float)(dVar13 + local_60);
        lVar8 = lVar8 + 2;
      }
      lVar11 = lVar11 + 4;
      lVar10 = lVar10 + 2;
      lVar7 = local_50 + 1;
    }
    anon_unknown.dwarf_29dd79::writeRead
              (local_70,&local_a0,(Array2D<Imath_3_2::half> *)&stack0xffffffffffffff48,&local_88,w,h
               ,in_stack_ffffffffffffff38,h,(int)lVar14,(int)lVar15);
    poVar5 = std::operator<<((ostream *)&std::cout,"random bits");
    std::endl<char,std::char_traits<char>>(poVar5);
    local_56[0] = 0x5a5a;
    local_56[1] = 0x5a5a;
    local_56[2] = 0x5a5a;
    for (lVar7 = 0; lVar7 != 0x3b; lVar7 = lVar7 + 1) {
      for (lVar10 = 0; lVar10 != 0xab; lVar10 = lVar10 + 1) {
        uVar3 = Imath_3_2::nrand48(local_56);
        local_a0._data[local_a0._sizeY * lVar7 + lVar10] = uVar3;
        lVar11 = lVar15;
        do {
          do {
            lVar15 = lVar11;
            uVar2 = Imath_3_2::nrand48(local_56);
            *(undefined2 *)((long)pvVar6 + lVar10 * 2 + lVar11 * lVar7 * 2) = uVar2;
            uVar1 = *(ushort *)((long)pvVar6 + lVar10 * 2 + lVar15 * lVar7 * 2);
            lVar11 = lVar15;
          } while ((uVar1 & 0x7fff) == 0x7c00);
        } while ((~uVar1 & 0x7c00) == 0 && (uVar1 & 0x3ff) != 0);
        do {
          fVar4 = (float)Imath_3_2::nrand48(local_56);
          local_88._data[local_88._sizeY * lVar7 + lVar10] = fVar4;
        } while (0x7f7fffff < (uint)ABS(fVar4));
      }
    }
    anon_unknown.dwarf_29dd79::writeRead
              (local_70,&local_a0,(Array2D<Imath_3_2::half> *)&stack0xffffffffffffff48,&local_88,w,h
               ,in_stack_ffffffffffffff38,h,(int)lVar14,(int)lVar15);
    lVar7 = local_68 + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar5);
  Imf_3_4::Array2D<float>::~Array2D(&local_88);
  Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&stack0xffffffffffffff48);
  Imf_3_4::Array2D<unsigned_int>::~Array2D(&local_a0);
  return;
}

Assistant:

void
testTiledCompression (const std::string& tempDir)
{
    try
    {
        cout << "Testing pixel data types and data "
                "window offsets for tiled files"
             << endl;

        const int W    = 171;
        const int H    = 59;
        const int DX[] = {-17, 0, 23};
        const int DY[] = {-29, 0, 13};
        const int XS   = 15;
        const int YS   = 15;

        Array2D<unsigned int> pi (H, W);
        Array2D<half>         ph (H, W);
        Array2D<float>        pf (H, W);

        //
        // If the following assertion fails, new pixel types have
        // been added to the Imf library; testing code for the new
        // pixel types should be added to this file.
        //

        assert (NUM_PIXELTYPES == 3);

        for (int i = 0; i < 3; ++i)
        {
            cout << endl
                 << "xOffset = " << DX[i]
                 << ", "
                    "yOffset = "
                 << DY[i] << endl;

            fillPixels1 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels2 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels3 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels4 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}